

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall TestBadStuff::testBadFile(TestBadStuff *this)

{
  ostream *poVar1;
  istream *this_00;
  bool result;
  undefined1 local_299;
  ValidSchema schema;
  shared_count local_290;
  string error;
  char *local_268;
  char *local_260;
  const_string local_258;
  const_string local_248;
  undefined **local_238;
  undefined1 local_230;
  undefined8 *local_228;
  char *local_220;
  ifstream in;
  
  std::operator<<((ostream *)&std::cout,"TestBadFile\n");
  avro::ValidSchema::ValidSchema(&schema);
  std::ifstream::ifstream(&in,"agjoewejefkjs",_S_in);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  this_00 = (istream *)&in;
  result = (bool)avro::compileJsonSchema(this_00,&schema,(string *)&error);
  local_248.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_248.m_end = "";
  local_258.m_begin = "";
  local_258.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_248,0x274,&local_258);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_001f1370;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = "";
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_260 = "";
  local_299 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_238,&local_268,0x274,1,2,&result,"result",&local_299,"false");
  poVar1 = std::operator<<((ostream *)&std::cout,"(intentional) error: ");
  poVar1 = std::operator<<(poVar1,(string *)&error);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&error);
  std::ifstream::~ifstream(&in);
  boost::detail::shared_count::~shared_count(&local_290);
  return;
}

Assistant:

void testBadFile() 
    {
        std::cout << "TestBadFile\n";

        avro::ValidSchema schema;
        std::ifstream in("agjoewejefkjs");
        std::string error;
        bool result = avro::compileJsonSchema(in, schema, error);
        BOOST_CHECK_EQUAL(result, false);
        std::cout << "(intentional) error: " << error << '\n';
    }